

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O0

ScriptSet * __thiscall icu_63::ScriptSet::set(ScriptSet *this,UScriptCode script,UErrorCode *status)

{
  UBool UVar1;
  uint32_t bit;
  uint32_t index;
  UErrorCode *status_local;
  UScriptCode script_local;
  ScriptSet *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((script < USCRIPT_COMMON) || ((USCRIPT_OLD_SOGDIAN|USCRIPT_COPTIC) < script)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this->bits[(uint)(script / 0x20)] =
           1 << ((byte)script & 0x1f) | this->bits[(uint)(script / 0x20)];
    }
  }
  return this;
}

Assistant:

ScriptSet &ScriptSet::set(UScriptCode script, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (script < 0 || script >= (int32_t)sizeof(bits) * 8) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    uint32_t index = script / 32;
    uint32_t bit   = 1 << (script & 31);
    bits[index] |= bit;
    return *this;
}